

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strtoull.c
# Opt level: O1

ulonglong strtoull(char *__nptr,char **__endptr,int __base)

{
  undefined1 auVar1 [16];
  unsigned_long uVar2;
  unsigned_long uVar3;
  char sign;
  char *p;
  char local_29;
  char *local_28;
  uint local_1c;
  
  local_29 = '+';
  local_1c = __base;
  local_28 = _PDCLIB_strtox_prelim(__nptr,&local_29,(int *)&local_1c);
  if (local_1c - 0x25 < 0xffffffdd) {
    uVar3 = 0;
  }
  else {
    auVar1 = ZEXT816(0) << 0x40 | ZEXT816(0xffffffffffffffff);
    uVar2 = _PDCLIB_strtox_main(&local_28,local_1c,0xffffffffffffffff,
                                SUB168(auVar1 / ZEXT416(local_1c),0),
                                SUB164(auVar1 % ZEXT416(local_1c),0),&local_29);
    if (__endptr != (char **)0x0) {
      if (local_28 != (char *)0x0) {
        __nptr = local_28;
      }
      *__endptr = __nptr;
    }
    uVar3 = -uVar2;
    if (local_29 == '+') {
      uVar3 = uVar2;
    }
  }
  return uVar3;
}

Assistant:

unsigned long long int strtoull( const char * s, char ** endptr, int base )
{
    unsigned long long int rc;
    char sign = '+';
    const char * p = _PDCLIB_strtox_prelim( s, &sign, &base );

    if ( base < 2 || base > 36 )
    {
        return 0;
    }

    rc = _PDCLIB_strtox_main( &p, ( unsigned )base, ( uintmax_t )ULLONG_MAX, ( uintmax_t )( ULLONG_MAX / base ), ( int )( ULLONG_MAX % base ), &sign );

    if ( endptr != NULL )
    {
        *endptr = ( p != NULL ) ? ( char * ) p : ( char * ) s;
    }

    return ( sign == '+' ) ? rc : -rc;
}